

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RendererTests.cpp
# Opt level: O0

void __thiscall agge::tests::RendererTests::BitmapFillRespectsFillingAreaRect(RendererTests *this)

{
  pixel_conflict1 *ppVar1;
  allocator local_1e1;
  string local_1e0 [32];
  LocationInfo local_1c0;
  undefined1 local_198 [8];
  fill_log_entry reference2 [5];
  allocator local_111;
  string local_110 [32];
  LocationInfo local_f0;
  undefined1 local_c8 [8];
  fill_log_entry reference1 [3];
  undefined1 local_70 [8];
  blender<int,_unsigned_char> blender;
  bitmap<int,_0UL,_0UL> bitmap;
  rect_i r2;
  rect_i r1;
  RendererTests *this_local;
  
  r2.x2 = 1;
  r2.y2 = 2;
  bitmap._width = 2;
  bitmap._height = 3;
  r2.x1 = 9;
  r2.y1 = 8;
  tests::mocks::bitmap<int,_0UL,_0UL>::bitmap
            ((bitmap<int,_0UL,_0UL> *)
             &blender.filling_log.
              super__Vector_base<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,10,10);
  tests::mocks::blender<int,_unsigned_char>::blender((blender<int,_unsigned_char> *)local_70);
  fill<agge::tests::mocks::bitmap<int,0ul,0ul>,agge::tests::mocks::blender<int,unsigned_char>>
            ((bitmap<int,_0UL,_0UL> *)
             &blender.filling_log.
              super__Vector_base<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(rect_i *)&r2.x2,
             (blender<int,_unsigned_char> *)local_70);
  ppVar1 = tests::mocks::bitmap<int,_0UL,_0UL>::row_ptr
                     ((bitmap<int,_0UL,_0UL> *)
                      &blender.filling_log.
                       super__Vector_base<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,2);
  local_c8 = (undefined1  [8])(ppVar1 + 1);
  reference1[0].pixels._0_4_ = 1;
  reference1[0].pixels._4_4_ = 2;
  reference1[0].x = 2;
  ppVar1 = tests::mocks::bitmap<int,_0UL,_0UL>::row_ptr
                     ((bitmap<int,_0UL,_0UL> *)
                      &blender.filling_log.
                       super__Vector_base<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,3);
  reference1[0]._16_8_ = ppVar1 + 1;
  reference1[1].pixels._0_4_ = 1;
  reference1[1].pixels._4_4_ = 3;
  reference1[1].x = 2;
  ppVar1 = tests::mocks::bitmap<int,_0UL,_0UL>::row_ptr
                     ((bitmap<int,_0UL,_0UL> *)
                      &blender.filling_log.
                       super__Vector_base<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,4);
  reference1[1]._16_8_ = ppVar1 + 1;
  reference1[2].pixels._0_4_ = 1;
  reference1[2].pixels._4_4_ = 4;
  reference1[2].x = 2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_110,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererTests.cpp"
             ,&local_111);
  ut::LocationInfo::LocationInfo(&local_f0,(string *)local_110,0x3ec);
  ut::
  are_equal<agge::tests::mocks::blender<int,unsigned_char>::fill_log_entry,3ul,std::vector<agge::tests::mocks::blender<int,unsigned_char>::fill_log_entry,std::allocator<agge::tests::mocks::blender<int,unsigned_char>::fill_log_entry>>>
            ((fill_log_entry (*) [3])local_c8,
             (vector<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry>_>
              *)local_70,&local_f0);
  ut::LocationInfo::~LocationInfo(&local_f0);
  std::__cxx11::string::~string(local_110);
  std::allocator<char>::~allocator((allocator<char> *)&local_111);
  std::
  vector<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry>_>
  ::clear((vector<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry>_>
           *)local_70);
  fill<agge::tests::mocks::bitmap<int,0ul,0ul>,agge::tests::mocks::blender<int,unsigned_char>>
            ((bitmap<int,_0UL,_0UL> *)
             &blender.filling_log.
              super__Vector_base<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(rect_i *)&bitmap._width,
             (blender<int,_unsigned_char> *)local_70);
  ppVar1 = tests::mocks::bitmap<int,_0UL,_0UL>::row_ptr
                     ((bitmap<int,_0UL,_0UL> *)
                      &blender.filling_log.
                       super__Vector_base<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,3);
  local_198 = (undefined1  [8])(ppVar1 + 2);
  reference2[0].pixels._0_4_ = 2;
  reference2[0].pixels._4_4_ = 3;
  reference2[0].x = 7;
  ppVar1 = tests::mocks::bitmap<int,_0UL,_0UL>::row_ptr
                     ((bitmap<int,_0UL,_0UL> *)
                      &blender.filling_log.
                       super__Vector_base<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,4);
  reference2[0]._16_8_ = ppVar1 + 2;
  reference2[1].pixels._0_4_ = 2;
  reference2[1].pixels._4_4_ = 4;
  reference2[1].x = 7;
  ppVar1 = tests::mocks::bitmap<int,_0UL,_0UL>::row_ptr
                     ((bitmap<int,_0UL,_0UL> *)
                      &blender.filling_log.
                       super__Vector_base<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,5);
  reference2[1]._16_8_ = ppVar1 + 2;
  reference2[2].pixels._0_4_ = 2;
  reference2[2].pixels._4_4_ = 5;
  reference2[2].x = 7;
  ppVar1 = tests::mocks::bitmap<int,_0UL,_0UL>::row_ptr
                     ((bitmap<int,_0UL,_0UL> *)
                      &blender.filling_log.
                       super__Vector_base<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,6);
  reference2[2]._16_8_ = ppVar1 + 2;
  reference2[3].pixels._0_4_ = 2;
  reference2[3].pixels._4_4_ = 6;
  reference2[3].x = 7;
  ppVar1 = tests::mocks::bitmap<int,_0UL,_0UL>::row_ptr
                     ((bitmap<int,_0UL,_0UL> *)
                      &blender.filling_log.
                       super__Vector_base<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,7);
  reference2[3]._16_8_ = ppVar1 + 2;
  reference2[4].pixels._0_4_ = 2;
  reference2[4].pixels._4_4_ = 7;
  reference2[4].x = 7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1e0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererTests.cpp"
             ,&local_1e1);
  ut::LocationInfo::LocationInfo(&local_1c0,(string *)local_1e0,0x3fd);
  ut::
  are_equal<agge::tests::mocks::blender<int,unsigned_char>::fill_log_entry,5ul,std::vector<agge::tests::mocks::blender<int,unsigned_char>::fill_log_entry,std::allocator<agge::tests::mocks::blender<int,unsigned_char>::fill_log_entry>>>
            ((fill_log_entry (*) [5])local_198,
             (vector<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry>_>
              *)local_70,&local_1c0);
  ut::LocationInfo::~LocationInfo(&local_1c0);
  std::__cxx11::string::~string(local_1e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
  tests::mocks::blender<int,_unsigned_char>::~blender((blender<int,_unsigned_char> *)local_70);
  tests::mocks::bitmap<int,_0UL,_0UL>::~bitmap
            ((bitmap<int,_0UL,_0UL> *)
             &blender.filling_log.
              super__Vector_base<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<int,_unsigned_char>::fill_log_entry>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

test( BitmapFillRespectsFillingAreaRect )
			{
				// INIT
				rect_i r1 = { 1, 2, 3, 5 };
				rect_i r2 = { 2, 3, 9, 8 };
				mocks::bitmap<int> bitmap(10, 10);
				mocks::blender<int, uint8_t> blender;

				// ACT
				fill(bitmap, r1, blender);

				// ASSERT
				mocks::blender<int, uint8_t>::fill_log_entry reference1[] = {
					{ bitmap.row_ptr(2) + 1, 1, 2, 2 },
					{ bitmap.row_ptr(3) + 1, 1, 3, 2 },
					{ bitmap.row_ptr(4) + 1, 1, 4, 2 },
				};

				assert_equal(reference1, blender.filling_log);

				// INIT
				blender.filling_log.clear();

				// ACT
				fill(bitmap, r2, blender);

				// ASSERT
				mocks::blender<int, uint8_t>::fill_log_entry reference2[] = {
					{ bitmap.row_ptr(3) + 2, 2, 3, 7 },
					{ bitmap.row_ptr(4) + 2, 2, 4, 7 },
					{ bitmap.row_ptr(5) + 2, 2, 5, 7 },
					{ bitmap.row_ptr(6) + 2, 2, 6, 7 },
					{ bitmap.row_ptr(7) + 2, 2, 7, 7 },
				};

				assert_equal(reference2, blender.filling_log);
			}